

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall
tonk::gateway::HTTPRequester::OnDone
          (HTTPRequester *this,Result *result,uint httpResponseCode,char *response,uint bytes)

{
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar1;
  error_code ec;
  
  if (this->Done == false) {
    std::function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)>::operator()
              (&this->Callback,result,httpResponseCode,response,bytes);
    this->Done = true;
    pbVar1 = (this->Socket_TCP_Control)._M_t.
             super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 != (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *
                  )0x0) {
      std::_V2::system_category();
      asio::stream_socket_service<asio::ip::tcp>::close
                ((pbVar1->
                 super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                 super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.service_,
                 (int)pbVar1 + 8);
    }
  }
  return;
}

Assistant:

void HTTPRequester::OnDone(
    const Result& result,
    unsigned httpResponseCode,
    const char* response,
    unsigned bytes)
{
    if (Done) {
        return;
    }

    Callback(result, httpResponseCode, response, bytes);
    Done = true;

    // Close TCP socket so any stuck reads/writes get canceled
    if (Socket_TCP_Control) {
        asio::error_code ec;
        Socket_TCP_Control->close(ec);
    }
}